

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Hint.c
# Opt level: O3

Vec_Int_t * Llb_ManCollectHighFanoutObjects(Aig_Man_t *pAig,int nCandMax,int fCisOnly)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int Temp;
  long lVar10;
  
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  pVVar6 = pAig->vObjs;
  if (pVVar6->nSize < 1) {
    iVar3 = 0;
  }
  else {
    lVar10 = 0;
    do {
      piVar5 = (int *)pVVar6->pArray[lVar10];
      if (piVar5 != (int *)0x0) {
        uVar8 = (uint)*(ulong *)(piVar5 + 6);
        if ((((uVar8 & 7) == 2) && (pAig->nTruePis <= *piVar5)) ||
           ((fCisOnly == 0 && (0xfffffffd < (uVar8 & 7) - 7)))) {
          Vec_IntPush(pVVar4,(uint)(*(ulong *)(piVar5 + 6) >> 6) & 0x3ffffff);
          pVVar6 = pAig->vObjs;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar6->nSize);
    iVar3 = pVVar4->nSize;
    piVar5 = pVVar4->pArray;
  }
  qsort(piVar5,(long)iVar3,4,Vec_IntSortCompare2);
  uVar8 = iVar3 - 1U;
  if (nCandMax < (int)(iVar3 - 1U)) {
    uVar8 = nCandMax;
  }
  if ((int)uVar8 < 0) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar3 = piVar5[uVar8];
  free(piVar5);
  free(pVVar4);
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  pVVar6 = pAig->vObjs;
  if (pVVar6->nSize < 1) {
    iVar3 = 0;
  }
  else {
    lVar10 = 0;
    do {
      piVar5 = (int *)pVVar6->pArray[lVar10];
      if (piVar5 != (int *)0x0) {
        uVar7 = (uint)*(ulong *)(piVar5 + 6);
        if (((((uVar7 & 7) == 2) && (pAig->nTruePis <= *piVar5)) ||
            ((fCisOnly == 0 && (0xfffffffd < (uVar7 & 7) - 7)))) &&
           (iVar3 <= (int)((uint)(*(ulong *)(piVar5 + 6) >> 6) & 0x3ffffff))) {
          Vec_IntPush(pVVar4,piVar5[9]);
          pVVar6 = pAig->vObjs;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar6->nSize);
    iVar3 = pVVar4->nSize;
  }
  if (iVar3 < (int)uVar8) {
    __assert_fail("Vec_IntSize(vResult) >= nCandMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Hint.c"
                  ,0x7f,"Vec_Int_t *Llb_ManCollectHighFanoutObjects(Aig_Man_t *, int, int)");
  }
  if (1 < iVar3) {
    puVar1 = (uint *)pVVar4->pArray;
    do {
      uVar8 = *puVar1;
      uVar9 = 0;
      bVar2 = false;
      do {
        if (((int)uVar8 < 0) || (pVVar6->nSize <= (int)uVar8)) {
LAB_00823fe5:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar7 = puVar1[uVar9 + 1];
        if (((long)(int)uVar7 < 0) || ((uint)pVVar6->nSize <= uVar7)) goto LAB_00823fe5;
        if (*(uint *)((long)pVVar6->pArray[uVar8] + 0x18) >> 6 <
            *(uint *)((long)pVVar6->pArray[(int)uVar7] + 0x18) >> 6) {
          puVar1[uVar9] = uVar7;
          puVar1[uVar9 + 1] = uVar8;
          bVar2 = true;
          uVar7 = uVar8;
        }
        uVar8 = uVar7;
        uVar9 = uVar9 + 1;
      } while (iVar3 - 1 != uVar9);
    } while ((bVar2) && (1 < iVar3));
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Llb_ManCollectHighFanoutObjects( Aig_Man_t * pAig, int nCandMax, int fCisOnly )
{
    Vec_Int_t * vFanouts, * vResult;
    Aig_Obj_t * pObj; 
    int i, fChanges, PivotValue;
//    int Entry;
    // collect fanout counts
    vFanouts = Vec_IntAlloc( 100 );
    Aig_ManForEachObj( pAig, pObj, i )
    {
//        if ( !Aig_ObjIsCi(pObj) && (fCisOnly || !Aig_ObjIsNode(pObj)) )
        if ( !Saig_ObjIsLo(pAig,pObj) && (fCisOnly || !Aig_ObjIsNode(pObj)) )
            continue;
        Vec_IntPush( vFanouts, Aig_ObjRefs(pObj) );
    }
    Vec_IntSort( vFanouts, 1 );
    // pick the separator
    nCandMax = Abc_MinInt( nCandMax, Vec_IntSize(vFanouts) - 1 );
    PivotValue = Vec_IntEntry( vFanouts, nCandMax );
    Vec_IntFree( vFanouts );
    // collect obj satisfying the constraints
    vResult = Vec_IntAlloc( 100 );
    Aig_ManForEachObj( pAig, pObj, i )
    {
//        if ( !Aig_ObjIsCi(pObj) && (fCisOnly || !Aig_ObjIsNode(pObj)) )
        if ( !Saig_ObjIsLo(pAig,pObj) && (fCisOnly || !Aig_ObjIsNode(pObj)) )
            continue;
        if ( Aig_ObjRefs(pObj) < PivotValue )
            continue;
        Vec_IntPush( vResult, Aig_ObjId(pObj) );
    }
    assert( Vec_IntSize(vResult) >= nCandMax );
    // order in the decreasing order of fanouts
    do
    {
        fChanges = 0;
        for ( i = 0; i < Vec_IntSize(vResult) - 1; i++ )
            if ( Aig_ObjRefs(Aig_ManObj(pAig, Vec_IntEntry(vResult, i))) < 
                 Aig_ObjRefs(Aig_ManObj(pAig, Vec_IntEntry(vResult, i+1))) )
            {
                int Temp = Vec_IntEntry( vResult, i );
                Vec_IntWriteEntry( vResult, i, Vec_IntEntry(vResult, i+1) );
                Vec_IntWriteEntry( vResult, i+1, Temp );
                fChanges = 1;
            }
    }
    while ( fChanges );
/*
    Vec_IntForEachEntry( vResult, Entry, i )
        printf( "%d ", Aig_ObjRefs(Aig_ManObj(pAig, Entry)) );
printf( "\n" );
*/
    return vResult;
}